

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExpressionStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,ExpressionSyntax *args_2,
          Token *args_3)

{
  Token semi;
  ExpressionStatementSyntax *pEVar1;
  ExpressionStatementSyntax *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  NamedLabelSyntax *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pEVar1 = (ExpressionStatementSyntax *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  semi.info = in_RSI;
  semi.kind = (short)in_RDX;
  semi._2_1_ = (char)((ulong)in_RDX >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  semi.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::ExpressionStatementSyntax::ExpressionStatementSyntax
            (in_RCX,in_R8,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(in_R8->super_SyntaxNode).parent,
             *(ExpressionSyntax **)&in_R8->super_SyntaxNode,semi);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }